

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

Bucket __thiscall
QHashPrivate::Data<QHashPrivate::Node<SubArray,_Macro>_>::findBucket<SubArray>
          (Data<QHashPrivate::Node<SubArray,_Macro>_> *this,SubArray *key)

{
  size_t hash;
  char *pcVar1;
  QLatin1String QVar2;
  Bucket BVar3;
  
  pcVar1 = (key->array).d.ptr;
  if (pcVar1 == (char *)0x0) {
    pcVar1 = (char *)&QByteArray::_empty;
  }
  QVar2.m_data = pcVar1 + key->from;
  QVar2.m_size = key->len;
  hash = qHash(QVar2,this->seed);
  BVar3 = findBucketWithHash<SubArray>(this,key,hash);
  return BVar3;
}

Assistant:

Bucket findBucket(const K &key) const noexcept
    {
        size_t hash = QHashPrivate::calculateHash(key, seed);
        return findBucketWithHash(key, hash);
    }